

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void RPCRunLater(string *name,function<void_()> func,int64_t nSeconds)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UniValue *__return_storage_ptr__;
  int64_t in_RDX;
  pointer *__ptr;
  string *psVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
  *category;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  _Head_base<0UL,_RPCTimerBase_*,_false> local_58;
  int64_t nSeconds_local;
  UniqueLock<GlobalMutex> criticalblock17;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (timerInterface == (RPCTimerInterface *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&criticalblock17,"No timer handler registered for RPC",
               (allocator<char> *)&local_58);
    JSONRPCError(__return_storage_ptr__,-0x7f5b,(string *)&criticalblock17);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    nSeconds_local = in_RDX;
    UniqueLock<GlobalMutex>::UniqueLock
              (&criticalblock17,&g_deadline_timers_mutex,"g_deadline_timers_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/server.cpp"
               ,0x23a,false);
    category = &deadlineTimers_abi_cxx11_;
    psVar4 = name;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
    ::erase(&deadlineTimers_abi_cxx11_._M_t,name);
    bVar2 = LogAcceptCategory((LogFlags)category,(Level)psVar4);
    if (bVar2) {
      iVar3 = (*timerInterface->_vptr_RPCTimerInterface[2])();
      local_58._M_head_impl = (RPCTimerBase *)CONCAT44(extraout_var,iVar3);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/server.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "RPCRunLater";
      logging_function._M_len = 0xb;
      LogPrintFormatInternal<std::__cxx11::string,long,char_const*>
                (logging_function,source_file,0x23c,RPC,Debug,(ConstevalFormatString<3U>)0xccd3d6,
                 name,&nSeconds_local,(char **)&local_58);
      in_RDX = nSeconds_local;
    }
    iVar3 = (*timerInterface->_vptr_RPCTimerInterface[3])(timerInterface,nSeconds,in_RDX * 1000);
    local_58._M_head_impl = (RPCTimerBase *)CONCAT44(extraout_var_00,iVar3);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>>
    ::
    _M_emplace_unique<std::__cxx11::string_const&,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>>
                *)&deadlineTimers_abi_cxx11_,name,
               (unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_> *)&local_58);
    if (local_58._M_head_impl != (RPCTimerBase *)0x0) {
      (*(local_58._M_head_impl)->_vptr_RPCTimerBase[1])();
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock17.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void RPCRunLater(const std::string& name, std::function<void()> func, int64_t nSeconds)
{
    if (!timerInterface)
        throw JSONRPCError(RPC_INTERNAL_ERROR, "No timer handler registered for RPC");
    LOCK(g_deadline_timers_mutex);
    deadlineTimers.erase(name);
    LogDebug(BCLog::RPC, "queue run of timer %s in %i seconds (using %s)\n", name, nSeconds, timerInterface->Name());
    deadlineTimers.emplace(name, std::unique_ptr<RPCTimerBase>(timerInterface->NewTimer(func, nSeconds*1000)));
}